

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtCofactor0(word *pTruth,int nWords,int iVar)

{
  word *pwVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar2 = (byte)iVar;
  if (nWords == 1) {
    *pTruth = (s_Truths6Neg[iVar] & *pTruth) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
              s_Truths6Neg[iVar] & *pTruth;
  }
  else if (iVar < 6) {
    uVar5 = 0;
    uVar6 = (ulong)(uint)nWords;
    if (nWords < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      pTruth[uVar5] =
           (s_Truths6Neg[iVar] & pTruth[uVar5]) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
           s_Truths6Neg[iVar] & pTruth[uVar5];
    }
  }
  else {
    pwVar1 = pTruth + nWords;
    uVar4 = 1 << (bVar2 - 6 & 0x1f);
    bVar2 = bVar2 - 6 & 0x1f;
    uVar3 = 0 << bVar2;
    if (0 < (int)uVar4) {
      uVar3 = uVar4;
    }
    for (; pTruth < pwVar1; pTruth = pTruth + (2 << bVar2)) {
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        pTruth[(long)(int)uVar4 + uVar6] = pTruth[uVar6];
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCofactor0( word * pTruth, int nWords, int iVar )
{
    if ( nWords == 1 )
        pTruth[0] = ((pTruth[0] & s_Truths6Neg[iVar]) << (1 << iVar)) | (pTruth[0] & s_Truths6Neg[iVar]);
    else if ( iVar <= 5 )
    {
        int w, shift = (1 << iVar);
        for ( w = 0; w < nWords; w++ )
            pTruth[w] = ((pTruth[w] & s_Truths6Neg[iVar]) << shift) | (pTruth[w] & s_Truths6Neg[iVar]);
    }
    else // if ( iVar > 5 )
    {
        word * pLimit = pTruth + nWords;
        int i, iStep = Abc_TtWordNum(iVar);
        for ( ; pTruth < pLimit; pTruth += 2*iStep )
            for ( i = 0; i < iStep; i++ )
                pTruth[i + iStep] = pTruth[i];
    }
}